

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<capnp::DynamicList::Reader&>(StringTree *__return_storage_ptr__,kj *this,Reader *params)

{
  Reader *this_00;
  StringTree *pSVar1;
  Reader *value;
  StringTree local_50;
  kj *local_18;
  Reader *params_local;
  
  local_18 = this;
  params_local = (Reader *)__return_storage_ptr__;
  this_00 = fwd<capnp::DynamicList::Reader&>((Reader *)this);
  _::toStringTreeOrCharSequence<capnp::DynamicList::Reader&>(&local_50,(_ *)this_00,value);
  pSVar1 = StringTree::concat(&local_50);
  StringTree::StringTree(__return_storage_ptr__,pSVar1);
  StringTree::~StringTree(&local_50);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}